

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

int Fra_LcrNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  long lVar2;
  int iVar3;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int nPart1;
  int nPart0;
  Aig_Obj_t *pOut1;
  Aig_Obj_t *pOut0;
  Aig_Man_t *pFraig;
  Fra_Lcr_t *pLcr;
  Fra_Man_t *pTemp;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  
  lVar2 = *(long *)((long)(pObj0->field_5).pData + 0x40);
  iVar3 = Aig_ObjIsCi(pObj0);
  if (iVar3 == 0) {
    __assert_fail("Aig_ObjIsCi(pObj0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                  ,0xd0,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar3 = Aig_ObjIsCi(pObj1);
  if (iVar3 == 0) {
    __assert_fail("Aig_ObjIsCi(pObj1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                  ,0xd1,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar3 = *(int *)(*(long *)(lVar2 + 0x18) + (long)(pObj0->field_0).pNext * 4);
  iVar1 = *(int *)(*(long *)(lVar2 + 0x18) + (long)(pObj1->field_0).pNext * 4);
  if (iVar3 != iVar1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                  ,0xd9,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (iVar3 == iVar1) {
    p = (Aig_Man_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(lVar2 + 0x28),iVar3);
    pAVar4 = Aig_ManCo(p,*(int *)(*(long *)(lVar2 + 0x20) + (long)(pObj0->field_0).pNext * 4));
    pAVar5 = Aig_ManCo(p,*(int *)(*(long *)(lVar2 + 0x20) + (long)(pObj1->field_0).pNext * 4));
    pAVar4 = Aig_ObjFanin0(pAVar4);
    pAVar5 = Aig_ObjFanin0(pAVar5);
    return (int)(pAVar4 == pAVar5);
  }
  __assert_fail("nPart0 == nPart1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraLcr.c"
                ,0xdc,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Fra_LcrNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * pTemp = (Fra_Man_t *)pObj0->pData;
    Fra_Lcr_t * pLcr = (Fra_Lcr_t *)pTemp->pBmc;
    Aig_Man_t * pFraig;
    Aig_Obj_t * pOut0, * pOut1;
    int nPart0, nPart1;
    assert( Aig_ObjIsCi(pObj0) );
    assert( Aig_ObjIsCi(pObj1) );
    // find the partition to which these nodes belong
    nPart0 = pLcr->pInToOutPart[(long)pObj0->pNext];
    nPart1 = pLcr->pInToOutPart[(long)pObj1->pNext];
    // if this is the result of refinement of the class created const-1 nodes
    // the nodes may end up in different partions - we assume them equivalent
    if ( nPart0 != nPart1 )
    {
        assert( 0 );
        return 1;
    }
    assert( nPart0 == nPart1 );
    pFraig = (Aig_Man_t *)Vec_PtrEntry( pLcr->vFraigs, nPart0 );
    // get the fraig outputs
    pOut0 = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj0->pNext] );
    pOut1 = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj1->pNext] );
    return Aig_ObjFanin0(pOut0) == Aig_ObjFanin0(pOut1);
}